

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

shared_ptr<Instance> get_shared_instance(string *type,string *value)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<Instance> sVar3;
  __shared_ptr<StringInstance,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  (type->_M_dataplus)._M_p = (pointer)0x0;
  type->_M_string_length = 0;
  bVar1 = std::operator==(value,"Boolean");
  if (bVar1) {
    std::make_shared<BooleanInstance,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_Stack_28);
    std::__shared_ptr<Instance,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Instance,(__gnu_cxx::_Lock_policy)2> *)type,
               (__shared_ptr<BooleanInstance,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  }
  bVar1 = std::operator==(value,"Character");
  if (bVar1) {
    std::make_shared<CharacterInstance,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_Stack_28);
    std::__shared_ptr<Instance,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Instance,(__gnu_cxx::_Lock_policy)2> *)type,
               (__shared_ptr<CharacterInstance,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  }
  bVar1 = std::operator==(value,"Integer");
  if (bVar1) {
    std::make_shared<IntegerInstance,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_Stack_28);
    std::__shared_ptr<Instance,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Instance,(__gnu_cxx::_Lock_policy)2> *)type,
               (__shared_ptr<IntegerInstance,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  }
  bVar1 = std::operator==(value,"Float");
  if (bVar1) {
    std::make_shared<FloatInstance,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_Stack_28);
    std::__shared_ptr<Instance,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Instance,(__gnu_cxx::_Lock_policy)2> *)type,
               (__shared_ptr<FloatInstance,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  }
  bVar1 = std::operator==(value,"String");
  _Var2._M_pi = extraout_RDX;
  if (bVar1) {
    std::make_shared<StringInstance,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_Stack_28);
    std::__shared_ptr<Instance,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Instance,(__gnu_cxx::_Lock_policy)2> *)type,&_Stack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)type;
  return (shared_ptr<Instance>)sVar3.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Instance> get_shared_instance(const std::string& type, const std::string& value) {
    std::shared_ptr<Instance> instance;
    if (type == "Boolean")
        instance = std::make_shared<BooleanInstance>(value);
    if (type == "Character")
        instance = std::make_shared<CharacterInstance>(value);
    if (type == "Integer")
        instance = std::make_shared<IntegerInstance>(value);
    if (type == "Float")
        instance = std::make_shared<FloatInstance>(value);
    if (type == "String")
        instance = std::make_shared<StringInstance>(value);
    return instance;
}